

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

ErrorOr<llvm::MD5::MD5Result> *
llvm::sys::fs::md5_contents(ErrorOr<llvm::MD5::MD5Result> *__return_storage_ptr__,Twine *Path)

{
  undefined8 in_RAX;
  error_code EC;
  error_code eVar1;
  int FD;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  eVar1 = openFileForRead(Path,&local_14,F_None,(SmallVectorImpl<char> *)0x0);
  EC._M_cat = eVar1._M_cat;
  if (eVar1._M_value == 0) {
    md5_contents(__return_storage_ptr__,local_14);
    close(local_14);
  }
  else {
    EC._4_4_ = 0;
    EC._M_value = eVar1._M_value;
    ErrorOr<llvm::MD5::MD5Result>::ErrorOr(__return_storage_ptr__,EC);
  }
  return __return_storage_ptr__;
}

Assistant:

ErrorOr<MD5::MD5Result> md5_contents(const Twine &Path) {
  int FD;
  if (auto EC = openFileForRead(Path, FD, OF_None))
    return EC;

  auto Result = md5_contents(FD);
  close(FD);
  return Result;
}